

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Config::getProcessName_abi_cxx11_(string *__return_storage_ptr__,Config *this)

{
  Config *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,&(this->m_data).processName);
  return __return_storage_ptr__;
}

Assistant:

std::string Config::getProcessName() const { return m_data.processName; }